

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_object_clear(json_t *json)

{
  json_object_t *object;
  json_t *json_local;
  
  if ((json == (json_t *)0x0) || (json->type != JSON_OBJECT)) {
    json_local._4_4_ = -1;
  }
  else {
    hashtable_clear((hashtable_t *)(json + 1));
    json_local._4_4_ = 0;
  }
  return json_local._4_4_;
}

Assistant:

int json_object_clear(json_t *json)
{
	json_object_t *object;

	if (!json_is_object(json))
		return -1;

	object = json_to_object(json);
	hashtable_clear(&object->hashtable);

	return 0;
}